

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O0

void __thiscall trng::truncated_normal_dist<double>::param_type::update_Phi(param_type *this)

{
  long in_RDI;
  double dVar1;
  double dVar2;
  double in_stack_ffffffffffffffd8;
  
  dVar2 = *(double *)(in_RDI + 0x10);
  dVar1 = std::numeric_limits<double>::infinity();
  if (dVar2 <= -dVar1) {
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  else {
    dVar2 = math::Phi(in_stack_ffffffffffffffd8);
    *(double *)(in_RDI + 0x20) = dVar2;
  }
  dVar2 = *(double *)(in_RDI + 0x18);
  dVar1 = std::numeric_limits<double>::infinity();
  if (dVar1 <= dVar2) {
    *(undefined8 *)(in_RDI + 0x28) = 0x3ff0000000000000;
  }
  else {
    dVar2 = math::Phi(in_stack_ffffffffffffffd8);
    *(double *)(in_RDI + 0x28) = dVar2;
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
      void update_Phi() {
        if (a_ > -math::numeric_limits<result_type>::infinity())
          Phi_a = math::Phi((a_ - mu_) / sigma_);
        else
          Phi_a = result_type(0);
        if (b_ < math::numeric_limits<result_type>::infinity())
          Phi_b = math::Phi((b_ - mu_) / sigma_);
        else
          Phi_b = result_type(1);
      }